

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O1

Reals __thiscall Omega_h::refine_qualities_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *candidates)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  Int ent_dim;
  LO size_in;
  size_t sVar5;
  Reals RVar6;
  Write<double> quals_w;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  Reals cand_quals;
  Reals coords;
  LOs cv2v;
  LOs ev2v;
  MetricRefineQualities<3,_3> measure;
  type f;
  Adj e2c;
  Write<double> local_1d8;
  Alloc *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  Alloc *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  Alloc *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  LOs local_198;
  Alloc *local_188;
  void *local_180;
  Write<double> local_178;
  Read<signed_char> local_168;
  LOs local_158;
  Alloc *local_148;
  element_type *local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  element_type *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  element_type *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  Alloc *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  type local_f8;
  Adj local_58;
  
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&local_128,ent_dim);
  Mesh::ask_verts_of((Mesh *)&local_138,ent_dim);
  Mesh::ask_up(&local_58,mesh,1,3);
  local_1a8 = local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1b8 = local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_1c8 = local_58.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.codes.write_.shared_alloc_.alloc)->use_count =
           (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_58.codes.write_.shared_alloc_.direct_ptr;
  Mesh::coords((Mesh *)&local_148);
  local_158.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 1) == 0) {
    sVar5 = (local_158.write_.shared_alloc_.alloc)->size;
  }
  else {
    sVar5 = (ulong)local_158.write_.shared_alloc_.alloc >> 3;
  }
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc =
           (Alloc *)((local_158.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_158.write_.shared_alloc_.alloc)->use_count =
           (local_158.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_158.write_.shared_alloc_.direct_ptr = (candidates->write_).shared_alloc_.direct_ptr;
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)&local_118,mesh,&local_158);
  pAVar3 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_f8.candidates.write_.shared_alloc_.alloc = (Alloc *)&local_f8.ev2v;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  size_in = (LO)(sVar5 >> 2);
  Write<double>::Write(&local_1d8,size_in,(string *)&local_f8);
  if (local_f8.candidates.write_.shared_alloc_.alloc != (Alloc *)&local_f8.ev2v) {
    operator_delete(local_f8.candidates.write_.shared_alloc_.alloc,
                    (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(local_f8.ev2v.write_.shared_alloc_.alloc)->size)->_M_ptr +
                           1));
  }
  local_f8.candidates.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_f8.candidates.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.candidates.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.candidates.write_.shared_alloc_.alloc =
           (Alloc *)((local_f8.candidates.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.candidates.write_.shared_alloc_.alloc)->use_count =
           (local_f8.candidates.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.candidates.write_.shared_alloc_.direct_ptr =
       (candidates->write_).shared_alloc_.direct_ptr;
  local_f8.ev2v.write_.shared_alloc_.alloc = (Alloc *)local_128._M_pi;
  if (((ulong)local_128._M_pi & 7) == 0 && (Alloc *)local_128._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.ev2v.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_128._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_128._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_128._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_f8.ev2v.write_.shared_alloc_.direct_ptr = local_120;
  local_f8.coords.write_.shared_alloc_.alloc = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.coords.write_.shared_alloc_.alloc = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_f8.coords.write_.shared_alloc_.direct_ptr = local_140;
  local_f8.e2ec.write_.shared_alloc_.alloc = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.e2ec.write_.shared_alloc_.alloc = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_f8.e2ec.write_.shared_alloc_.direct_ptr = local_1a0;
  local_f8.ec2c.write_.shared_alloc_.alloc = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.ec2c.write_.shared_alloc_.alloc = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_f8.ec2c.write_.shared_alloc_.direct_ptr = local_1b0;
  local_f8.ec_codes.write_.shared_alloc_.alloc = local_1c8;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.ec_codes.write_.shared_alloc_.alloc = (Alloc *)(local_1c8->size * 8 + 1);
    }
    else {
      local_1c8->use_count = local_1c8->use_count + 1;
    }
  }
  local_f8.ec_codes.write_.shared_alloc_.direct_ptr = local_1c0;
  local_f8.cv2v.write_.shared_alloc_.alloc = (Alloc *)local_138._M_pi;
  if (((ulong)local_138._M_pi & 7) == 0 && (Alloc *)local_138._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.cv2v.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_138._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_138._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_138._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_f8.cv2v.write_.shared_alloc_.direct_ptr = local_130;
  local_f8.measure.vert_metrics.write_.shared_alloc_.alloc = (Alloc *)local_118._M_pi;
  if (((ulong)local_118._M_pi & 7) == 0 && (Alloc *)local_118._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.measure.vert_metrics.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_118._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_f8.measure.vert_metrics.write_.shared_alloc_.direct_ptr = local_110;
  local_f8.measure.midpt_metrics.write_.shared_alloc_.alloc = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.measure.midpt_metrics.write_.shared_alloc_.alloc = (Alloc *)(local_108->size * 8 + 1)
      ;
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  local_f8.measure.midpt_metrics.write_.shared_alloc_.direct_ptr = local_100;
  local_f8.quals_w.shared_alloc_.alloc = local_1d8.shared_alloc_.alloc;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.quals_w.shared_alloc_.alloc =
           (Alloc *)((local_1d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1d8.shared_alloc_.alloc)->use_count = (local_1d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.quals_w.shared_alloc_.direct_ptr = local_1d8.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&local_f8,"refine_qualities");
  local_178.shared_alloc_.alloc = local_1d8.shared_alloc_.alloc;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.shared_alloc_.alloc = (Alloc *)((local_1d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1d8.shared_alloc_.alloc)->use_count = (local_1d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.shared_alloc_.direct_ptr = local_1d8.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_168,&local_178);
  pAVar3 = local_178.shared_alloc_.alloc;
  if (((ulong)local_178.shared_alloc_.alloc & 7) == 0 &&
      local_178.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_198.write_.shared_alloc_.alloc = local_168.write_.shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198.write_.shared_alloc_.alloc =
           (Alloc *)((local_168.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.write_.shared_alloc_.alloc)->use_count =
           (local_168.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_198.write_.shared_alloc_.direct_ptr = local_168.write_.shared_alloc_.direct_ptr;
  local_188 = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_180 = (candidates->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,&local_198,-1.0,(Int)&local_188);
  pAVar3 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    piVar1 = &local_188->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
      operator_delete(local_168.write_.shared_alloc_.alloc,0x48);
    }
  }
  refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&local_f8);
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1d8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d8.shared_alloc_.alloc);
      operator_delete(local_1d8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    piVar1 = &local_108->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108);
      operator_delete(local_108,0x48);
    }
  }
  if (((ulong)local_118._M_pi & 7) == 0 && (Alloc *)local_118._M_pi != (Alloc *)0x0) {
    p_Var2 = local_118._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_118._M_pi);
      operator_delete(local_118._M_pi,0x48);
    }
  }
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    piVar1 = &local_148->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148);
      operator_delete(local_148,0x48);
    }
  }
  pAVar3 = local_1c8;
  if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
    piVar1 = &local_1c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    piVar1 = &local_1b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    piVar1 = &local_1a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8);
      operator_delete(pAVar3,0x48);
    }
  }
  Adj::~Adj(&local_58);
  pvVar4 = extraout_RDX;
  if (((ulong)local_138._M_pi & 7) == 0 && (Alloc *)local_138._M_pi != (Alloc *)0x0) {
    p_Var2 = local_138._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_138._M_pi);
      operator_delete(local_138._M_pi,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_128._M_pi & 7) == 0 && (Alloc *)local_128._M_pi != (Alloc *)0x0) {
    p_Var2 = local_128._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_128._M_pi);
      operator_delete(local_128._M_pi,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals refine_qualities_tmpl(Mesh* mesh, LOs candidates) {
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_verts_of(mesh_dim);
  auto e2c = mesh->ask_up(EDGE, mesh_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto coords = mesh->coords();
  auto ncands = candidates.size();
  auto measure = MetricRefineQualities<mesh_dim, metric_dim>(mesh, candidates);
  Write<Real> quals_w(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = candidates[cand];
    auto eev2v = gather_verts<2>(ev2v, e);
    auto ep = gather_vectors<2, mesh_dim>(coords, eev2v);
    auto midp = (ep[0] + ep[1]) / 2.;
    auto minqual = 1.0;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto code = ec_codes[ec];
      auto cce = code_which_down(code);
      auto rot = code_rotation(code);
      auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
      for (Int eev = 0; eev < 2; ++eev) {
        /* a new cell is formed from an old cell by finding
           its side that is opposite to one of the edge endpoints
           and connecting it to the midpoint to form the new cell
           (see refine_domain_interiors) */
        auto cev = eev ^ rot;
        auto ccv = simplex_down_template(mesh_dim, EDGE, cce, cev);
        auto ccs = simplex_opposite_template(mesh_dim, VERT, ccv);
        Few<LO, mesh_dim> csv2v;
        Few<Vector<mesh_dim>, mesh_dim + 1> ncp;
        for (Int csv = 0; csv < mesh_dim; ++csv) {
          auto ccv2 = simplex_down_template(mesh_dim, mesh_dim - 1, ccs, csv);
          auto v2 = ccv2v[ccv2];
          csv2v[csv] = v2;
          ncp[csv] = get_vector<mesh_dim>(coords, v2);
        }
        ncp[mesh_dim] = midp;
        flip_new_elem<mesh_dim>(&csv2v[0]);
        flip_new_elem<mesh_dim>(&ncp[0]);
        auto cqual = measure.measure(cand, ncp, csv2v);
        minqual = min2(minqual, cqual);
      }
    }
    quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "refine_qualities");
  auto cand_quals = Reals(quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, candidates, -1.0, 1);
}